

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

char * glslang::TQualifier::getLayoutDepthString(TLayoutDepth d)

{
  char *pcStack_10;
  TLayoutDepth d_local;
  
  switch(d) {
  case EldAny:
    pcStack_10 = "depth_any";
    break;
  case EldGreater:
    pcStack_10 = "depth_greater";
    break;
  case EldLess:
    pcStack_10 = "depth_less";
    break;
  case EldUnchanged:
    pcStack_10 = "depth_unchanged";
    break;
  default:
    pcStack_10 = "none";
  }
  return pcStack_10;
}

Assistant:

static const char* getLayoutDepthString(TLayoutDepth d)
    {
        switch (d) {
        case EldAny:       return "depth_any";
        case EldGreater:   return "depth_greater";
        case EldLess:      return "depth_less";
        case EldUnchanged: return "depth_unchanged";
        default:           return "none";
        }
    }